

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

bool __thiscall
dg::llvmdg::LazyLLVMCallGraph::calls(LazyLLVMCallGraph *this,Function *F,Function *what)

{
  bool bVar1;
  FuncNode *this_00;
  FuncNode *x;
  Function *local_20;
  Function *local_18;
  
  local_20 = what;
  local_18 = F;
  bVar1 = hasFn(this,F);
  if (!bVar1) {
    _populateCalledFunctions(this,F);
  }
  this_00 = GenericCallGraph<const_llvm::Function_*>::get(&this->_cg,&local_18);
  x = GenericCallGraph<const_llvm::Function_*>::get(&this->_cg,&local_20);
  if (x == (FuncNode *)0x0 || this_00 == (FuncNode *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = GenericCallGraph<const_llvm::Function_*>::FuncNode::calls(this_00,x);
  }
  return bVar1;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fn1 = _cg.get(F);
        auto fn2 = _cg.get(what);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }